

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scomplex.c
# Opt level: O3

singlecomplex c_sgn(singlecomplex *z)

{
  double dVar1;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  singlecomplex sVar2;
  
  dVar1 = c_abs(z);
  fVar5 = (float)dVar1;
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    auVar3._8_8_ = 0;
    auVar3._0_4_ = z->r;
    auVar3._4_4_ = z->i;
    auVar4._4_4_ = fVar5;
    auVar4._0_4_ = fVar5;
    auVar4._8_4_ = fVar5;
    auVar4._12_4_ = fVar5;
    auVar4 = divps(auVar3,auVar4);
    sVar2 = auVar4._0_8_;
  }
  else {
    sVar2.r = 1.0;
    sVar2.i = 0.0;
  }
  return sVar2;
}

Assistant:

singlecomplex c_sgn(singlecomplex *z)
{
    register float t = c_abs(z);
    register singlecomplex retval;

    if (t == 0.0) {
	retval.r = 1.0, retval.i = 0.0;
    } else {
	retval.r = z->r / t, retval.i = z->i / t;
    }

    return retval;
}